

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void update_gop_length(RATE_CONTROL *rc,PRIMARY_RATE_CONTROL *p_rc,int idx,int is_final_pass)

{
  int in_ECX;
  int in_EDX;
  PRIMARY_RATE_CONTROL *in_RSI;
  long in_RDI;
  
  if (in_ECX != 0) {
    *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + -1;
    in_RSI->cur_gf_index = in_RSI->cur_gf_index + 1;
  }
  in_RSI->constrained_gf_group = (uint)(*(int *)(in_RDI + 0x2c) <= in_EDX);
  set_baseline_gf_interval(in_RSI,in_EDX);
  *(int *)(in_RDI + 0x18) = in_RSI->baseline_gf_interval;
  return;
}

Assistant:

static void update_gop_length(RATE_CONTROL *rc, PRIMARY_RATE_CONTROL *p_rc,
                              int idx, int is_final_pass) {
  if (is_final_pass) {
    rc->intervals_till_gf_calculate_due--;
    p_rc->cur_gf_index++;
  }

  // Was the group length constrained by the requirement for a new KF?
  p_rc->constrained_gf_group = (idx >= rc->frames_to_key) ? 1 : 0;

  set_baseline_gf_interval(p_rc, idx);
  rc->frames_till_gf_update_due = p_rc->baseline_gf_interval;
}